

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagebox.cpp
# Opt level: O3

void __thiscall DQuickSaveMenu::HandleResult(DQuickSaveMenu *this,bool res)

{
  undefined7 in_register_00000031;
  FSoundID local_4;
  
  if ((int)CONCAT71(in_register_00000031,res) != 0) {
    G_SaveGame((quickSaveSlot->Filename).Chars,quickSaveSlot->Title);
    S_FindSound("menu/dismiss");
    S_Sound(0x22,&local_4,snd_menuvolume.Value,0.0);
    M_ClearMenus();
    return;
  }
  (*(this->super_DMessageBoxMenu).super_DMenu.super_DObject._vptr_DObject[0xd])();
  DMessageBoxMenu::CloseSound(&this->super_DMessageBoxMenu);
  return;
}

Assistant:

void DQuickSaveMenu::HandleResult(bool res)
{
	if (res)
	{
		G_SaveGame (quickSaveSlot->Filename.GetChars(), quickSaveSlot->Title);
		S_Sound (CHAN_VOICE | CHAN_UI, "menu/dismiss", snd_menuvolume, ATTN_NONE);
		M_ClearMenus();
	}
	else
	{
		Close();
		CloseSound();
	}
}